

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

Bytes __thiscall Omega_h::filter_parents(Omega_h *this,Parents *c2p,Int parent_dim)

{
  char *file;
  void *extraout_RDX;
  Bytes BVar1;
  Write<signed_char> local_178;
  undefined1 local_168 [8];
  type f;
  string local_128 [32];
  undefined1 local_108 [8];
  Write<signed_char> filter;
  allocator local_c1;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [35];
  ScopedTimer local_5d;
  Int local_5c;
  ScopedTimer omega_h_scoped_function_timer;
  Parents *pPStack_58;
  Int parent_dim_local;
  Parents *c2p_local;
  ulong local_20;
  ulong local_10;
  
  local_5c = parent_dim;
  pPStack_58 = c2p;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,&local_c1);
  std::operator+(local_a0,(char *)local_c0);
  std::__cxx11::to_string((__cxx11 *)&filter.shared_alloc_.direct_ptr,0x10a);
  std::operator+(local_80,local_a0);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_5d,"filter_parents",file);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&filter.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  if (((ulong)(c2p->parent_idx).write_.shared_alloc_.alloc & 1) == 0) {
    local_10 = ((c2p->parent_idx).write_.shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(c2p->parent_idx).write_.shared_alloc_.alloc >> 3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_128,"",(allocator *)((long)&f.filter.shared_alloc_.direct_ptr + 7));
  Write<signed_char>::Write((Write<signed_char> *)local_108,(LO)(local_10 >> 2),(string *)local_128)
  ;
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.filter.shared_alloc_.direct_ptr + 7));
  Parents::Parents((Parents *)local_168,c2p);
  f.c2p.codes.write_.shared_alloc_.direct_ptr._0_4_ = local_5c;
  Write<signed_char>::Write((Write<signed_char> *)&f.parent_dim,(Write<signed_char> *)local_108);
  if (((ulong)(c2p->parent_idx).write_.shared_alloc_.alloc & 1) == 0) {
    local_20 = ((c2p->parent_idx).write_.shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(c2p->parent_idx).write_.shared_alloc_.alloc >> 3;
  }
  parallel_for<Omega_h::filter_parents(Omega_h::Parents,int)::__0>
            ((LO)(local_20 >> 2),(type *)local_168);
  Write<signed_char>::Write(&local_178,(Write<signed_char> *)local_108);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_178);
  Write<signed_char>::~Write(&local_178);
  filter_parents(Omega_h::Parents,int)::$_0::~__0((__0 *)local_168);
  Write<signed_char>::~Write((Write<signed_char> *)local_108);
  ScopedTimer::~ScopedTimer(&local_5d);
  BVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar1.write_.shared_alloc_;
}

Assistant:

Bytes filter_parents(Parents const c2p, Int const parent_dim) {
  OMEGA_H_TIME_FUNCTION;
  Write<Byte> filter(c2p.parent_idx.size());
  auto f = OMEGA_H_LAMBDA(LO c) {
    auto const code = c2p.codes[c];
    if (amr::code_parent_dim(code) == parent_dim)
      filter[c] = 1;
    else
      filter[c] = 0;
  };
  parallel_for(c2p.parent_idx.size(), std::move(f));
  return filter;
}